

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::t_formatter<spdlog::details::scoped_padder>::format
          (t_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  scoped_padder p;
  scoped_padder sStack_58;
  byte abStack_22 [5];
  undefined2 local_1d;
  char local_1b [3];
  char *local_18;
  
  uVar3 = msg->thread_id | 1;
  lVar2 = 0x3f;
  if (uVar3 != 0) {
    for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
    }
  }
  scoped_padder::scoped_padder
            (&sStack_58,
             (ulong)((uint)*(ushort *)
                            (::fmt::v7::detail::bsr2log10(int)::data + (uint)((int)lVar2 * 2)) -
                    (uint)(msg->thread_id <
                          *(ulong *)(::fmt::v7::detail::basic_data<void>::
                                     zero_or_powers_of_10_64_new +
                                    (ulong)*(ushort *)
                                            (::fmt::v7::detail::bsr2log10(int)::data +
                                            (uint)((int)lVar2 * 2)) * 8))),
             &(this->super_flag_formatter).padinfo_,dest);
  uVar3 = msg->thread_id;
  pcVar5 = local_1b;
  uVar4 = uVar3;
  if (99 < uVar3) {
    do {
      uVar4 = uVar3 / 100;
      *(undefined2 *)(pcVar5 + -2) =
           *(undefined2 *)(&::fmt::v7::detail::basic_data<void>::digits + (uVar3 % 100) * 2);
      pcVar5 = pcVar5 + -2;
      bVar1 = 9999 < uVar3;
      uVar3 = uVar4;
    } while (bVar1);
  }
  if (uVar4 < 10) {
    pcVar5[-1] = (byte)uVar4 | 0x30;
    local_18 = pcVar5 + -1;
  }
  else {
    *(undefined2 *)(pcVar5 + -2) =
         *(undefined2 *)(&::fmt::v7::detail::basic_data<void>::digits + uVar4 * 2);
    local_18 = pcVar5 + -2;
  }
  ::fmt::v7::detail::buffer<char>::append<char>(&dest->super_buffer<char>,local_18,local_1b);
  scoped_padder::~scoped_padder(&sStack_58);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        const auto field_size = ScopedPadder::count_digits(msg.thread_id);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(msg.thread_id, dest);
    }